

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::fastAccessDx
          (FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_> *this,
          int i)

{
  return ((((this->right_->fadexpr_).left_)->dx_).ptr_to_data[i] +
         (((this->right_->fadexpr_).right_)->dx_).ptr_to_data[i]) * (this->left_).constant_;
}

Assistant:

value_type fastAccessDx(int i) const { return right_.fastAccessDx(i) * left_.val();}